

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void reverse_data(float *data,int datalen)

{
  float fVar1;
  int local_1c;
  float temp;
  int right;
  int left;
  int datalen_local;
  float *data_local;
  
  local_1c = datalen + -1;
  for (temp = 0.0; (int)temp < local_1c; temp = (float)((int)temp + 1)) {
    fVar1 = data[(int)temp];
    data[(int)temp] = data[local_1c];
    data[local_1c] = fVar1;
    local_1c = local_1c + -1;
  }
  return;
}

Assistant:

void
reverse_data (float *data, int datalen)
{	int left, right ;
	float temp ;

	left = 0 ;
	right = datalen - 1 ;

	while (left < right)
	{	temp = data [left] ;
		data [left] = data [right] ;
		data [right] = temp ;
		left ++ ;
		right -- ;
		} ;

}